

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_max_iter(OSQPWorkspace *work,c_int max_iter_new)

{
  char *in_RSI;
  long in_RDI;
  c_int local_8;
  
  if (in_RDI == 0) {
    local_8 = _osqp_error(0,in_RSI);
  }
  else if ((long)in_RSI < 1) {
    printf("ERROR in %s: ","osqp_update_max_iter");
    printf("max_iter must be positive");
    printf("\n");
    local_8 = 1;
  }
  else {
    *(char **)(*(long *)(in_RDI + 0xb8) + 0x38) = in_RSI;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

c_int osqp_update_max_iter(OSQPWorkspace *work, c_int max_iter_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that max_iter is positive
  if (max_iter_new <= 0) {
#ifdef PRINTING
    c_eprint("max_iter must be positive");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update max_iter
  work->settings->max_iter = max_iter_new;

  return 0;
}